

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

StringRef __thiscall llvm::Triple::getARMCPUForArch(Triple *this,StringRef MArch)

{
  OSType OVar1;
  StringRef SVar2;
  StringRef SVar3;
  StringRef SVar4;
  StringRef SVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  ARM *this_00;
  StringRef Arch;
  StringRef SVar8;
  
  if (MArch.Length == 0) {
    MArch = getArchName(this);
  }
  SVar8.Length = (char *)MArch.Length;
  SVar8.Data = SVar8.Length;
  SVar8 = ARM::getCanonicalArchName((ARM *)MArch.Data,SVar8);
  Arch.Length = (char *)SVar8.Length;
  this_00 = (ARM *)SVar8.Data;
  switch(this->OS) {
  case FreeBSD:
  case NetBSD:
    if (Arch.Length == (char *)0x0) goto LAB_00190a65;
    if (Arch.Length == (char *)0x2) {
      if (*(short *)this_00 == 0x3676) goto LAB_00190a84;
      goto switchD_00190996_caseD_6;
    }
    break;
  case IOS:
  case MacOSX:
switchD_00190996_caseD_7:
    if (Arch.Length == (char *)0x0) goto LAB_00190a65;
    if (Arch.Length == (char *)0x3) {
      if (this_00[2] == (ARM)0x6b && *(short *)this_00 == 0x3776) {
        Arch.Length = "cortex-a7";
        goto LAB_00190a99;
      }
      goto switchD_00190996_caseD_6;
    }
    break;
  case Win32:
    Arch.Length = "cortex-a9";
    goto LAB_00190a99;
  default:
    if (this->OS - TvOS < 2) goto switchD_00190996_caseD_7;
  case Fuchsia:
  case KFreeBSD:
  case Linux:
  case Lv2:
  case OpenBSD:
  case Solaris:
switchD_00190996_caseD_6:
    if (Arch.Length == (char *)0x0) {
      Arch.Length = (char *)0x0;
LAB_00190a65:
      auVar6._8_8_ = 0;
      auVar6._0_8_ = Arch.Length;
      return (StringRef)(auVar6 << 0x40);
    }
  }
  Arch.Data = Arch.Length;
  SVar8 = ARM::getDefaultCPU(this_00,Arch);
  if (SVar8.Length != 0) {
    if (SVar8.Length != 7) {
      return SVar8;
    }
    if (*(int *)((long)SVar8.Data + 3) != 0x64696c61 || *(int *)SVar8.Data != 0x61766e69) {
      return SVar8;
    }
  }
  OVar1 = this->OS;
  Arch.Length = "cortex-a8";
  if ((OVar1 != NaCl) && (OVar1 != OpenBSD)) {
    if (OVar1 != NetBSD) {
      if ((MuslEABIHF < this->Environment) ||
         ((0x2220U >> (this->Environment & (Cygnus|Itanium)) & 1) == 0)) {
        SVar5.Length = 8;
        SVar5.Data = "arm7tdmi";
        return SVar5;
      }
LAB_00190a84:
      SVar4.Length = 0xc;
      SVar4.Data = "arm1176jzf-s";
      return SVar4;
    }
    uVar7 = this->Environment - GNUEABI;
    if (uVar7 < 6) {
      SVar2.Length = *(size_t *)(&DAT_001bb1b0 + (ulong)uVar7 * 8);
      SVar2.Data = &DAT_001bb1e0 + *(int *)(&DAT_001bb1e0 + (ulong)uVar7 * 4);
      return SVar2;
    }
    Arch.Length = "strongarm";
  }
LAB_00190a99:
  SVar3.Length = 9;
  SVar3.Data = Arch.Length;
  return SVar3;
}

Assistant:

StringRef Triple::getARMCPUForArch(StringRef MArch) const {
  if (MArch.empty())
    MArch = getArchName();
  MArch = ARM::getCanonicalArchName(MArch);

  // Some defaults are forced.
  switch (getOS()) {
  case llvm::Triple::FreeBSD:
  case llvm::Triple::NetBSD:
    if (!MArch.empty() && MArch == "v6")
      return "arm1176jzf-s";
    break;
  case llvm::Triple::Win32:
    // FIXME: this is invalid for WindowsCE
    return "cortex-a9";
  case llvm::Triple::MacOSX:
  case llvm::Triple::IOS:
  case llvm::Triple::WatchOS:
  case llvm::Triple::TvOS:
    if (MArch == "v7k")
      return "cortex-a7";
    break;
  default:
    break;
  }

  if (MArch.empty())
    return StringRef();

  StringRef CPU = ARM::getDefaultCPU(MArch);
  if (!CPU.empty() && !CPU.equals("invalid"))
    return CPU;

  // If no specific architecture version is requested, return the minimum CPU
  // required by the OS and environment.
  switch (getOS()) {
  case llvm::Triple::NetBSD:
    switch (getEnvironment()) {
    case llvm::Triple::GNUEABIHF:
    case llvm::Triple::GNUEABI:
    case llvm::Triple::EABIHF:
    case llvm::Triple::EABI:
      return "arm926ej-s";
    default:
      return "strongarm";
    }
  case llvm::Triple::NaCl:
  case llvm::Triple::OpenBSD:
    return "cortex-a8";
  default:
    switch (getEnvironment()) {
    case llvm::Triple::EABIHF:
    case llvm::Triple::GNUEABIHF:
    case llvm::Triple::MuslEABIHF:
      return "arm1176jzf-s";
    default:
      return "arm7tdmi";
    }
  }

  llvm_unreachable("invalid arch name");
}